

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.cpp
# Opt level: O1

string * __thiscall
iDynTree::Model::getFrameName_abi_cxx11_
          (string *__return_storage_ptr__,Model *this,FrameIndex frameIndex)

{
  pointer pbVar1;
  long lVar2;
  ostream *poVar3;
  long lVar4;
  size_type sVar5;
  pointer pcVar6;
  stringstream ss;
  long *local_1d8;
  long local_1c8 [2];
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  if ((frameIndex < 0) ||
     (lVar2 = ((long)(this->links).
                     super__Vector_base<iDynTree::Link,_std::allocator<iDynTree::Link>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(this->links).
                     super__Vector_base<iDynTree::Link,_std::allocator<iDynTree::Link>_>._M_impl.
                     super__Vector_impl_data._M_start >> 4) * 0x6db6db6db6db6db7,
     lVar2 - frameIndex == 0 || lVar2 < frameIndex)) {
    lVar2 = (long)(this->links).super__Vector_base<iDynTree::Link,_std::allocator<iDynTree::Link>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)(this->links).super__Vector_base<iDynTree::Link,_std::allocator<iDynTree::Link>_>.
                  _M_impl.super__Vector_impl_data._M_start >> 4;
    lVar4 = lVar2 * 0x6db6db6db6db6db7;
    lVar2 = frameIndex + lVar2 * -0x6db6db6db6db6db7;
    if ((SBORROW8(frameIndex,lVar4) != lVar2 < 0) ||
       (((long)(this->additionalFrames).
               super__Vector_base<iDynTree::Transform,_std::allocator<iDynTree::Transform>_>._M_impl
               .super__Vector_impl_data._M_finish -
         (long)(this->additionalFrames).
               super__Vector_base<iDynTree::Transform,_std::allocator<iDynTree::Transform>_>._M_impl
               .super__Vector_impl_data._M_start >> 5) * -0x5555555555555555 + lVar4 <= frameIndex))
    {
      std::__cxx11::stringstream::stringstream(local_1b8);
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"frameIndex ",0xb);
      poVar3 = std::ostream::_M_insert<long>((long)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar3," is not valid, should be between 0 and ",0x27);
      std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
      std::__cxx11::stringbuf::str();
      iDynTree::reportError("Model","getFrameName",(char *)local_1d8);
      if (local_1d8 != local_1c8) {
        operator_delete(local_1d8,local_1c8[0] + 1);
      }
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)__return_storage_ptr__,FRAME_INVALID_NAME_abi_cxx11_,
                 DAT_00187d78 + FRAME_INVALID_NAME_abi_cxx11_);
      std::__cxx11::stringstream::~stringstream(local_1b8);
      std::ios_base::~ios_base(local_138);
      return __return_storage_ptr__;
    }
    pbVar1 = (this->frameNames).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar6 = pbVar1[lVar2]._M_dataplus._M_p;
    sVar5 = pbVar1[lVar2]._M_string_length;
  }
  else {
    pbVar1 = (this->linkNames).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar6 = pbVar1[frameIndex]._M_dataplus._M_p;
    sVar5 = pbVar1[frameIndex]._M_string_length;
  }
  std::__cxx11::string::_M_construct<char*>((string *)__return_storage_ptr__,pcVar6,pcVar6 + sVar5);
  return __return_storage_ptr__;
}

Assistant:

std::string Model::getFrameName(const FrameIndex frameIndex) const
{
    if( frameIndex >= 0 && frameIndex < (FrameIndex)this->getNrOfLinks() )
    {
        return linkNames[frameIndex];
    }
    else if( frameIndex >= (FrameIndex)this->getNrOfLinks() && frameIndex < (FrameIndex)this->getNrOfFrames() )
    {
        return frameNames[frameIndex-getNrOfLinks()];
    }
    else
    {
        std::stringstream ss;
        ss << "frameIndex " << frameIndex << " is not valid, should be between 0 and " << this->getNrOfFrames()-1;
        reportError("Model","getFrameName",ss.str().c_str());
        return FRAME_INVALID_NAME;
    }
}